

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O3

PyObject * libxml_xmlErrorPtrWrap(xmlError *error)

{
  undefined8 *puVar1;
  PyObject *pPVar2;
  
  if (error != (xmlError *)0x0) {
    puVar1 = (undefined8 *)(*_xmlMalloc)(0x58);
    if (puVar1 != (undefined8 *)0x0) {
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[10] = 0;
      xmlCopyError(error,puVar1);
      pPVar2 = (PyObject *)PyCapsule_New(puVar1,"xmlErrorPtr",libxml_xmlDestructError);
      return pPVar2;
    }
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlErrorPtrWrap(const xmlError *error)
{
    PyObject *ret;
    xmlErrorPtr copy;

    if (error == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    copy = xmlMalloc(sizeof(*copy));
    if (copy == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    memset(copy, 0, sizeof(*copy));
    xmlCopyError(error, copy);
    ret = PyCapsule_New(copy, "xmlErrorPtr", libxml_xmlDestructError);
    return (ret);
}